

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_help
          (string *__return_storage_ptr__,Formatter *this,App *app,string *name,AppFormatMode mode)

{
  size_t sVar1;
  bool bVar2;
  ostream *poVar3;
  allocator local_219;
  string local_218;
  string local_1f8;
  string local_1d8 [32];
  stringstream out;
  ostream local_1a8 [376];
  
  if (mode == Sub) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[7])(__return_storage_ptr__,this,app,2);
  }
  else {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
    if (((app->name_)._M_string_length == 0) && (app->parent_ != (App *)0x0)) {
      bVar2 = ::std::operator!=(&app->group_,"SUBCOMMANDS");
      if (bVar2) {
        poVar3 = ::std::operator<<(local_1a8,(string *)&app->group_);
        ::std::operator<<(poVar3,':');
      }
    }
    (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_218,this,app);
    sVar1 = (this->super_FormatterBase).description_paragraph_width_;
    ::std::__cxx11::string::string((string *)&local_1f8,"",&local_219);
    detail::streamOutAsParagraph(local_1a8,&local_218,sVar1,&local_1f8,false);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::string::string(local_1d8,(string *)name);
    (*(this->super_FormatterBase)._vptr_FormatterBase[10])(&local_218,this,app,local_1d8);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::string::~string(local_1d8);
    make_groups_abi_cxx11_(&local_218,this,app,mode);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::~string((string *)&local_218);
    (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&local_218,this,app,(ulong)mode);
    ::std::operator<<(local_1a8,(string *)&local_218);
    ::std::__cxx11::string::~string((string *)&local_218);
    (*(this->super_FormatterBase)._vptr_FormatterBase[8])(&local_218,this,app);
    sVar1 = (this->super_FormatterBase).footer_paragraph_width_;
    ::std::__cxx11::string::string((string *)&local_1f8,"",&local_219);
    detail::streamOutAsParagraph(local_1a8,&local_218,sVar1,&local_1f8,false);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_218);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_help(const App *app, std::string name, AppFormatMode mode) const {
    // This immediately forwards to the make_expanded method. This is done this way so that subcommands can
    // have overridden formatters
    if(mode == AppFormatMode::Sub)
        return make_expanded(app, mode);

    std::stringstream out;
    if((app->get_name().empty()) && (app->get_parent() != nullptr)) {
        if(app->get_group() != "SUBCOMMANDS") {
            out << app->get_group() << ':';
        }
    }

    detail::streamOutAsParagraph(
        out, make_description(app), description_paragraph_width_, "");  // Format description as paragraph
    out << make_usage(app, name);
    // out << make_positionals(app);
    out << make_groups(app, mode);
    out << make_subcommands(app, mode);
    detail::streamOutAsParagraph(out, make_footer(app), footer_paragraph_width_);  // Format footer as paragraph

    return out.str();
}